

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewText::Update(DataViewText *this,DataModel *model)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  pointer this_00;
  Element *base_instance;
  SystemInterface *pSVar4;
  ElementText *this_01;
  SystemInterface *system_interface;
  String text;
  String new_text;
  Element *element_1;
  undefined1 local_c0 [8];
  String value;
  undefined1 local_88 [7];
  bool result;
  Variant variant;
  DataEntry *entry;
  iterator __end2;
  iterator __begin2;
  Vector<DataEntry> *__range2;
  DataExpressionInterface expression_interface;
  Element *element;
  bool entries_modified;
  DataModel *model_local;
  DataViewText *this_local;
  
  bVar2 = false;
  expression_interface.event = (Event *)DataView::GetElement(&this->super_DataView);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)&__range2,model,(Element *)expression_interface.event,
             (Event *)0x0);
  __end2 = ::std::
           vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>::
           begin(&this->data_entries);
  entry = (DataEntry *)
          ::std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
          ::end(&this->data_entries);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
                                *)&entry);
    if (!bVar3) {
      if (bVar2 != false) {
        base_instance = DataView::GetElement(&this->super_DataView);
        if (base_instance == (Element *)0x0) {
          Log::Message(LT_WARNING,
                       "Could not update data view text, element no longer valid. Was it destroyed?"
                      );
        }
        else {
          BuildText_abi_cxx11_((String *)((long)&text.field_2 + 8),this);
          ::std::__cxx11::string::string((string *)&system_interface);
          pSVar4 = GetSystemInterface();
          if (pSVar4 != (SystemInterface *)0x0) {
            (*pSVar4->_vptr_SystemInterface[3])
                      (pSVar4,&system_interface,(undefined1 *)((long)&text.field_2 + 8));
          }
          this_01 = rmlui_static_cast<Rml::ElementText*,Rml::Element*>(base_instance);
          ElementText::SetText(this_01,(String *)&system_interface);
          ::std::__cxx11::string::~string((string *)&system_interface);
          ::std::__cxx11::string::~string((string *)(text.field_2._M_local_buf + 8));
        }
      }
      return bVar2;
    }
    variant.data._24_8_ =
         __gnu_cxx::
         __normal_iterator<Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
         ::operator*(&__end2);
    bVar3 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)&((reference)variant.data._24_8_)->data_expression);
    if ((!bVar3) &&
       (bVar3 = Assert("RMLUI_ASSERT(entry.data_expression)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                       ,0x17a), !bVar3)) break;
    Variant::Variant((Variant *)local_88);
    this_00 = ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::
              operator->((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                          *)(variant.data._24_8_ + 8));
    bVar3 = DataExpression::Run(this_00,(DataExpressionInterface *)&__range2,(Variant *)local_88);
    ::std::__cxx11::string::string((string *)&element_1);
    Variant::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (Variant *)local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&element_1);
    ::std::__cxx11::string::~string((string *)&element_1);
    if ((bVar3) &&
       (bVar3 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(variant.data._24_8_ + 0x10),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c0), bVar3)) {
      ::std::__cxx11::string::operator=((string *)(variant.data._24_8_ + 0x10),(string *)local_c0);
      bVar2 = true;
    }
    ::std::__cxx11::string::~string((string *)local_c0);
    Variant::~Variant((Variant *)local_88);
    __gnu_cxx::
    __normal_iterator<Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
    ::operator++(&__end2);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool DataViewText::Update(DataModel& model)
{
	bool entries_modified = false;
	{
		Element* element = GetElement();
		DataExpressionInterface expression_interface(&model, element);

		for (DataEntry& entry : data_entries)
		{
			RMLUI_ASSERT(entry.data_expression);
			Variant variant;
			bool result = entry.data_expression->Run(expression_interface, variant);
			const String value = variant.Get<String>();
			if (result && entry.value != value)
			{
				entry.value = value;
				entries_modified = true;
			}
		}
	}

	if (entries_modified)
	{
		if (Element* element = GetElement())
		{
			String new_text = BuildText();
			String text;
			if (SystemInterface* system_interface = GetSystemInterface())
				system_interface->TranslateString(text, new_text);

			rmlui_static_cast<ElementText*>(element)->SetText(text);
		}
		else
		{
			Log::Message(Log::LT_WARNING, "Could not update data view text, element no longer valid. Was it destroyed?");
		}
	}

	return entries_modified;
}